

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlIsUnreserved(xmlURIPtr uri,char *cur)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (uri != (xmlURIPtr)0x0) {
    bVar1 = *cur;
    iVar2 = 1;
    if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
        (1 < bVar1 - 0x2d)) && ((bVar1 != 0x5f && (uVar3 = (uint)bVar1, uVar3 != 0x7e)))) {
      if ((uri->cleanup & 1U) == 0) {
        if (((uri->cleanup & 4U) == 0) ||
           (((' ' < (char)bVar1 &&
             ((0x3e < bVar1 - 0x22 ||
              ((0x5400000014000001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)))) &&
            ((4 < uVar3 - 0x7b || (uVar3 - 0x7b == 3)))))) {
          return 0;
        }
      }
      else {
        if (0x22 < uVar3 - 0x5b) {
          return 0;
        }
        if ((0x70000002fU >> ((ulong)(uVar3 - 0x5b) & 0x3f) & 1) == 0) {
          return 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlIsUnreserved(xmlURIPtr uri, const char *cur) {
    if (uri == NULL)
        return(0);

    if (ISA_STRICTLY_UNRESERVED(cur))
        return(1);

    if (uri->cleanup & XML_URI_ALLOW_UNWISE) {
        if (IS_UNWISE(cur))
            return(1);
    } else if (uri->cleanup & XML_URI_ALLOW_UCSCHAR) {
        if (ISA_UCSCHAR(cur))
            return(1);
    }

    return(0);
}